

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_expr_paren(JSParseState *s)

{
  int iVar1;
  JSParseState *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  iVar1 = js_parse_expect(in_stack_ffffffffffffffe8,0);
  if (iVar1 == 0) {
    iVar1 = js_parse_expr((JSParseState *)0x198511);
    if (iVar1 == 0) {
      iVar1 = js_parse_expect(in_stack_ffffffffffffffe8,0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static __exception int js_parse_expr_paren(JSParseState *s)
{
    if (js_parse_expect(s, '('))
        return -1;
    if (js_parse_expr(s))
        return -1;
    if (js_parse_expect(s, ')'))
        return -1;
    return 0;
}